

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O0

ScalarFunction * duckdb::VersionFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  bind_scalar_function_extended_t in_stack_00000060;
  bind_scalar_function_t in_stack_00000068;
  scalar_function_t *in_stack_00000070;
  LogicalType *in_stack_00000078;
  vector<duckdb::LogicalType,_true> *in_stack_00000080;
  ScalarFunction *in_stack_00000088;
  function_statistics_t in_stack_000000c0;
  init_local_state_t in_stack_000000c8;
  LogicalType *in_stack_000000d0;
  FunctionStability in_stack_000000d8;
  FunctionNullHandling in_stack_000000e0;
  bind_lambda_function_t in_stack_000000e8;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  LogicalTypeId in_stack_ffffffffffffff5f;
  LogicalType *in_stack_ffffffffffffff60;
  
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x2008240);
  LogicalType::LogicalType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  LogicalType::LogicalType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  ScalarFunction::ScalarFunction
            (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
             in_stack_00000068,in_stack_00000060,in_stack_000000c0,in_stack_000000c8,
             in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,in_stack_000000e8);
  LogicalType::~LogicalType((LogicalType *)0x20082d7);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x20082e1);
  LogicalType::~LogicalType((LogicalType *)0x20082ee);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20082fb);
  return in_RDI;
}

Assistant:

ScalarFunction VersionFun::GetFunction() {
	return ScalarFunction({}, LogicalType::VARCHAR, VersionFunction);
}